

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-101.cpp
# Opt level: O3

rc_size __thiscall
baryonyx::itm::
solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
::compute_reduced_costs<baryonyx::bit_array>
          (solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
           *this,row_iterator begin,row_iterator end,bit_array *x)

{
  uint *puVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  rc_data *prVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  rc_size rVar7;
  uint uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined8 in_XMM3_Qb;
  tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*> ht;
  double local_68;
  double local_60;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_40;
  _Head_base<0UL,_int_*,_false> local_38;
  
  rVar7.r_size = 0;
  rVar7.c_size = 0;
  if (begin != end) {
    uVar9 = 0;
    do {
      sparse_matrix<int>::column((sparse_matrix<int> *)&local_40,(int)this + 0x10);
      if ((tuple<int_*,_std::default_delete<int[]>_>)local_38._M_head_impl ==
          (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
          local_40._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl) {
        local_60 = 0.0;
        local_68 = 0.0;
      }
      else {
        auVar14 = ZEXT864(0) << 0x40;
        auVar15 = ZEXT864(0) << 0x40;
        do {
          uVar3 = *local_38._M_head_impl;
          uVar8 = uVar3 + 0x3f;
          if (-1 < (int)uVar3) {
            uVar8 = uVar3;
          }
          auVar12._0_8_ =
               (double)value_bit_array<-1,_1>::return_value
                       [(uint)((this->A).super_bit_array_impl.m_data._M_t.
                               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                               .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl
                               [(int)uVar8 >> 6] >> ((ulong)uVar3 & 0x3f)) & 1];
          auVar12._8_8_ = in_XMM3_Qb;
          puVar1 = (uint *)((long)local_38._M_head_impl + 4);
          local_38._M_head_impl = local_38._M_head_impl + 8;
          auVar10._8_8_ = 0;
          auVar10._0_8_ =
               (this->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
               super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
               super__Head_base<0UL,_double_*,_false>._M_head_impl[(int)uVar3];
          auVar10 = vfmadd231sd_fma(auVar14._0_16_,auVar12,auVar10);
          auVar14 = ZEXT1664(auVar10);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = (this->pi)._M_t.
                         super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                         super__Head_base<0UL,_double_*,_false>._M_head_impl[(int)*puVar1];
          auVar2 = vfmadd231sd_fma(auVar15._0_16_,auVar12,auVar2);
          auVar15 = ZEXT1664(auVar2);
        } while ((tuple<int_*,_std::default_delete<int[]>_>)local_38._M_head_impl !=
                 (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
                 local_40._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl);
        local_68 = auVar10._0_8_;
        local_60 = auVar2._0_8_;
      }
      (this->R)._M_t.
      super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
      .
      super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_false>
      ._M_head_impl[uVar9].id = (int)uVar9;
      dVar11 = quadratic_cost_type<double>::operator()(this->c,begin->column,x);
      prVar4 = (this->R)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_false>
               ._M_head_impl;
      local_68 = (dVar11 - local_60) - local_68;
      prVar4[uVar9].value = local_68;
      uVar3 = begin->value;
      uVar8 = uVar3 + 0x3f;
      if (-1 < (int)uVar3) {
        uVar8 = uVar3;
      }
      uVar5 = (this->A).super_bit_array_impl.m_data._M_t.
              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl[(int)uVar8 >> 6];
      prVar4[uVar9].f =
           value_bit_array<-1,_1>::return_value[(uint)(uVar5 >> ((ulong)uVar3 & 0x3f)) & 1];
      if ((uVar5 >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
        auVar6._8_8_ = 0x8000000000000000;
        auVar6._0_8_ = 0x8000000000000000;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = local_68;
        auVar10 = vxorpd_avx512vl(auVar13,auVar6);
        rVar7.r_size = rVar7.r_size + 1;
        rVar7.c_size = 0;
        dVar11 = (double)vmovlpd_avx(auVar10);
        prVar4[uVar9].value = dVar11;
      }
      uVar9 = uVar9 + 1;
      begin = begin + 1;
    } while (begin != end);
    rVar7 = (rc_size)((long)rVar7 << 0x20 | uVar9 & 0xffffffff);
  }
  return rVar7;
}

Assistant:

rc_size compute_reduced_costs(sparse_matrix<int>::row_iterator begin,
                                  sparse_matrix<int>::row_iterator end,
                                  const Xtype& x) noexcept
    {
        int r_size = 0;
        int c_size = 0;

        for (; begin != end; ++begin) {
            Float sum_a_pi = 0;
            Float sum_a_p = 0;

            auto ht = ap.column(begin->column);

            for (; std::get<0>(ht) != std::get<1>(ht); ++std::get<0>(ht)) {
                auto a = static_cast<Float>(A.get(std::get<0>(ht)->value));

                sum_a_pi += a * pi[std::get<0>(ht)->row];
                sum_a_p += a * P[std::get<0>(ht)->value];
            }

            R[r_size].id = r_size;
            R[r_size].value = c(begin->column, x) - sum_a_pi - sum_a_p;
            R[r_size].f = A.get(begin->value);

            if (R[r_size].is_negative_factor()) {
                R[r_size].value = -R[r_size].value;
                ++c_size;
            }

            ++r_size;
        }

        return { r_size, c_size };
    }